

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

string * __thiscall
smf::MidiFile::getGMInstrumentName_abi_cxx11_
          (string *__return_storage_ptr__,MidiFile *this,int patchIndex)

{
  allocator local_9;
  
  if (((int)this < 0) || (0x7f < (int)this)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               *(char **)(GMinstrument + ((ulong)this & 0xffffffff) * 8),&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MidiFile::getGMInstrumentName(int patchIndex) {
	if (patchIndex < 0) {
		return "";
	}
	if (patchIndex > 127) {
		return "";
	}
	return GMinstrument[patchIndex];
}